

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O1

void ParseSingleFile(char *filename,int lump,void *parser,ZCCParseState *state)

{
  Node *pNVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  int yymajor;
  Node *pNVar5;
  ZCCToken yyminor;
  ZCCToken yyminor_00;
  FScanner sc;
  anon_union_8_3_77c0fe9c_for_ZCCToken_0 local_140;
  undefined1 local_138 [8];
  FScanner local_130;
  
  uVar4 = (ulong)filename & 0xffffffff;
  FScanner::FScanner(&local_130);
  FScanner::OpenLumpNum(&local_130,(int)filename);
  *(FScanner **)((long)parser + 0x838) = &local_130;
  do {
    bVar2 = FScanner::GetToken(&local_130);
    if (!bVar2) {
LAB_00569a17:
      local_140.Int = 0xffffffff;
      yyminor_00._8_8_ = uVar4;
      yyminor_00.field_0.Float = local_140.Float;
      ZCCParse((void *)CONCAT44(in_register_00000034,lump),0x30,yyminor_00,(ZCCParseState *)parser);
      *(undefined8 *)((long)parser + 0x838) = 0;
      FScanner::~FScanner(&local_130);
      return;
    }
    uVar3 = FScanner::GetMessageLine(&local_130);
    uVar4 = (ulong)uVar3;
    switch(local_130.TokenType) {
    case 0x101:
      local_140.Int = FName::NameManager::FindName(&FName::NameData,local_130.String,false);
      yymajor = 0x36;
      break;
    case 0x102:
      local_140.String =
           FSharedStringArena::Alloc
                     ((FSharedStringArena *)parser,local_130.String,(long)local_130.StringLen);
      yymajor = 0x52;
      break;
    case 0x103:
      local_140.Int = local_130.Name.Index;
      yymajor = 0x80;
      break;
    case 0x104:
      local_140.Int = local_130.Number;
      yymajor = 0x7d;
      break;
    case 0x105:
      local_140.Int = local_130.Number;
      yymajor = 0x7e;
      break;
    case 0x106:
      local_140.Float = local_130.Float;
      yymajor = 0x7f;
      break;
    case 0x107:
      local_140.Int = FName::NameManager::FindName(&FName::NameData,local_130.String,false);
      yymajor = 0x44;
      break;
    default:
      pNVar1 = TokenMap.Nodes + (TokenMap.Size - 1 & (int)(short)local_130.TokenType);
      do {
        pNVar5 = pNVar1;
        if ((pNVar5 == (Node *)0x0) || (pNVar5->Next == (Node *)0x1)) {
          pNVar5 = (Node *)0x0;
          break;
        }
        pNVar1 = pNVar5->Next;
      } while ((pNVar5->Pair).Key != (short)local_130.TokenType);
      if (pNVar5 == (Node *)0x0) {
        FScanner::TokenName((FScanner *)local_138,local_130.TokenType,(char *)0x0);
        FScanner::ScriptMessage(&local_130,"Unexpected token %s.\n",local_138);
        FString::~FString((FString *)local_138);
        goto LAB_00569a17;
      }
      yymajor = (int)(pNVar5->Pair).Value.TokenType;
      local_140.Int._2_2_ = 0;
      local_140.Int._0_2_ = (pNVar5->Pair).Value.TokenName;
    }
    yyminor.SourceLoc = uVar3;
    yyminor.field_0 = local_140;
    yyminor._12_4_ = 0;
    ZCCParse((void *)CONCAT44(in_register_00000034,lump),yymajor,yyminor,(ZCCParseState *)parser);
  } while( true );
}

Assistant:

static void ParseSingleFile(const char *filename, int lump, void *parser, ZCCParseState &state)
{
	int tokentype;
	//bool failed;
	ZCCToken value;
	FScanner sc;

	if (filename != nullptr)
	{
		lump = Wads.CheckNumForFullName(filename, true);
		if (lump >= 0)
		{
			sc.OpenLumpNum(lump);
		}
		else
		{
			Printf("Could not find script lump '%s'\n", filename);
			return;
		}
	}
	else sc.OpenLumpNum(lump);

	state.sc = &sc;
	while (sc.GetToken())
	{
		value.SourceLoc = sc.GetMessageLine();
		switch (sc.TokenType)
		{
		case TK_StringConst:
			value.String = state.Strings.Alloc(sc.String, sc.StringLen);
			tokentype = ZCC_STRCONST;
			break;

		case TK_NameConst:
			value.Int = sc.Name;
			tokentype = ZCC_NAMECONST;
			break;

		case TK_IntConst:
			value.Int = sc.Number;
			tokentype = ZCC_INTCONST;
			break;

		case TK_UIntConst:
			value.Int = sc.Number;
			tokentype = ZCC_UINTCONST;
			break;

		case TK_FloatConst:
			value.Float = sc.Float;
			tokentype = ZCC_FLOATCONST;
			break;

		case TK_Identifier:
			value.Int = FName(sc.String);
			tokentype = ZCC_IDENTIFIER;
			break;

		case TK_NonWhitespace:
			value.Int = FName(sc.String);
			tokentype = ZCC_NWS;
			break;

		default:
			TokenMapEntry *zcctoken = TokenMap.CheckKey(sc.TokenType);
			if (zcctoken != nullptr)
			{
				tokentype = zcctoken->TokenType;
				value.Int = zcctoken->TokenName;
			}
			else
			{
				sc.ScriptMessage("Unexpected token %s.\n", sc.TokenName(sc.TokenType).GetChars());
				goto parse_end;
			}
			break;
		}
		ZCCParse(parser, tokentype, value, &state);
	}
parse_end:
	value.Int = -1;
	ZCCParse(parser, ZCC_EOF, value, &state);
	state.sc = nullptr;
}